

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long_long>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144> AVar1;
  FormatArgImpl *pFVar2;
  FormatSinkImpl *sink;
  
  if (((ulong)arg.ptr & 0xff) == 0x13) {
    pFVar2 = (FormatArgImpl *)0xffffffff80000000;
    if (-0x80000000 < (long)this) {
      pFVar2 = this;
    }
    if (0x7ffffffe < (long)pFVar2) {
      pFVar2 = (FormatArgImpl *)0x7fffffff;
    }
    *(int *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_) = (int)pFVar2;
    AVar1.value = true;
  }
  else {
    sink = (FormatSinkImpl *)(2L << (arg.buf[0] & 0x3f));
    if (((ulong)sink & 0x9fffa) == 0) {
      AVar1.value = false;
    }
    else {
      AVar1 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)this,(longlong)arg,spec,sink);
    }
  }
  return (bool)(AVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }